

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>
          (StringTree *this,anon_class_8_1_6ec8c47f *func)

{
  Branch *pBVar1;
  Array<kj::StringTree::Branch> *pAVar2;
  size_t end;
  ArrayPtr<const_char> AVar3;
  Branch *branch;
  Branch *__end2;
  Branch *__begin2;
  Array<kj::StringTree::Branch> *__range2;
  size_t pos;
  anon_class_8_1_6ec8c47f *func_local;
  StringTree *this_local;
  
  __range2 = (Array<kj::StringTree::Branch> *)0x0;
  __end2 = Array<kj::StringTree::Branch>::begin(&this->branches);
  pBVar1 = Array<kj::StringTree::Branch>::end(&this->branches);
  for (; __end2 != pBVar1; __end2 = __end2 + 1) {
    if (__range2 < (Array<kj::StringTree::Branch> *)__end2->index) {
      AVar3 = String::slice(&this->text,(size_t)__range2,__end2->index);
      _::anon_unknown_0::TestCase29::run::anon_class_8_1_6ec8c47f::operator()(func,AVar3);
      __range2 = (Array<kj::StringTree::Branch> *)__end2->index;
    }
    visit<kj::_::(anonymous_namespace)::TestCase29::run()::__0&>(&__end2->content,func);
  }
  pAVar2 = (Array<kj::StringTree::Branch> *)String::size(&this->text);
  if (__range2 < pAVar2) {
    end = String::size(&this->text);
    AVar3 = String::slice(&this->text,(size_t)__range2,end);
    _::anon_unknown_0::TestCase29::run::anon_class_8_1_6ec8c47f::operator()(func,AVar3);
  }
  return;
}

Assistant:

void StringTree::visit(Func&& func) const {
  size_t pos = 0;
  for (auto& branch: branches) {
    if (branch.index > pos) {
      func(text.slice(pos, branch.index));
      pos = branch.index;
    }
    branch.content.visit(func);
  }
  if (text.size() > pos) {
    func(text.slice(pos, text.size()));
  }
}